

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BeginGroup(void)

{
  ImVector<ImGuiGroupData> *this;
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiGroupData *pIVar3;
  float fVar4;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  this = &GImGui->GroupStack;
  ImVector<ImGuiGroupData>::resize(this,(GImGui->GroupStack).Size + 1);
  pIVar3 = ImVector<ImGuiGroupData>::back(this);
  pIVar3->WindowID = pIVar1->ID;
  pIVar3->BackupCursorPos = (pIVar1->DC).CursorPos;
  pIVar3->BackupCursorMaxPos = (pIVar1->DC).CursorMaxPos;
  (pIVar3->BackupIndent).x = (pIVar1->DC).Indent.x;
  (pIVar3->BackupGroupOffset).x = (pIVar1->DC).GroupOffset.x;
  pIVar3->BackupCurrLineSize = (pIVar1->DC).CurrLineSize;
  pIVar3->BackupCurrLineTextBaseOffset = (pIVar1->DC).CurrLineTextBaseOffset;
  pIVar3->BackupActiveIdIsAlive = pIVar2->ActiveIdIsAlive;
  pIVar3->BackupHoveredIdIsAlive = pIVar2->HoveredId != 0;
  pIVar3->BackupActiveIdPreviousFrameIsAlive = pIVar2->ActiveIdPreviousFrameIsAlive;
  pIVar3->EmitItem = true;
  fVar4 = ((pIVar1->DC).CursorPos.x - (pIVar1->Pos).x) - (pIVar1->DC).ColumnsOffset.x;
  (pIVar1->DC).GroupOffset.x = fVar4;
  (pIVar1->DC).Indent.x = fVar4;
  (pIVar1->DC).CursorMaxPos = (pIVar1->DC).CursorPos;
  (pIVar1->DC).CurrLineSize.x = 0.0;
  (pIVar1->DC).CurrLineSize.y = 0.0;
  if (pIVar2->LogEnabled == true) {
    pIVar2->LogLinePosY = -3.4028235e+38;
  }
  return;
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    g.GroupStack.resize(g.GroupStack.Size + 1);
    ImGuiGroupData& group_data = g.GroupStack.back();
    group_data.WindowID = window->ID;
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndent = window->DC.Indent;
    group_data.BackupGroupOffset = window->DC.GroupOffset;
    group_data.BackupCurrLineSize = window->DC.CurrLineSize;
    group_data.BackupCurrLineTextBaseOffset = window->DC.CurrLineTextBaseOffset;
    group_data.BackupActiveIdIsAlive = g.ActiveIdIsAlive;
    group_data.BackupHoveredIdIsAlive = g.HoveredId != 0;
    group_data.BackupActiveIdPreviousFrameIsAlive = g.ActiveIdPreviousFrameIsAlive;
    group_data.EmitItem = true;

    window->DC.GroupOffset.x = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffset.x;
    window->DC.Indent = window->DC.GroupOffset;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return
}